

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O3

Locale * __thiscall icu_63::ResourceBundle::getLocale(ResourceBundle *this)

{
  char *newLanguage;
  Locale *this_00;
  UErrorCode *status_00;
  UErrorCode status;
  UErrorCode local_1c;
  
  umtx_lock_63((UMutex *)gLocaleLock);
  this_00 = this->fLocale;
  if (this_00 == (Locale *)0x0) {
    status_00 = &local_1c;
    local_1c = U_ZERO_ERROR;
    newLanguage = ures_getLocaleInternal_63(this->fResource,status_00);
    this_00 = (Locale *)UMemory::operator_new((UMemory *)0xe0,(size_t)status_00);
    if (this_00 == (Locale *)0x0) {
      this->fLocale = (Locale *)0x0;
      this_00 = Locale::getDefault();
    }
    else {
      Locale::Locale(this_00,newLanguage,(char *)0x0,(char *)0x0,(char *)0x0);
      this->fLocale = this_00;
    }
  }
  umtx_unlock_63((UMutex *)gLocaleLock);
  return this_00;
}

Assistant:

const Locale &ResourceBundle::getLocale(void) const {
    Mutex lock(&gLocaleLock);
    if (fLocale != NULL) {
        return *fLocale;
    }
    UErrorCode status = U_ZERO_ERROR;
    const char *localeName = ures_getLocaleInternal(fResource, &status);
    ResourceBundle *ncThis = const_cast<ResourceBundle *>(this);
    ncThis->fLocale = new Locale(localeName);
    return ncThis->fLocale != NULL ? *ncThis->fLocale : Locale::getDefault();
}